

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu382.c
# Opt level: O0

MPP_RET hal_h265d_vdpu382_gen_regs(void *hal,HalTaskInfo *syn)

{
  MppFrameFormat MVar1;
  RK_U32 RVar2;
  MppCbCtx *pMVar3;
  size_t sVar4;
  MppBuffer local_100;
  int local_d8;
  int local_d4;
  uint local_d0;
  uint local_cc;
  MppFrame local_c8;
  MppFrame mframe_3;
  MppFrame mframe_2;
  MppFrame mframe_1;
  RK_U32 local_a8;
  RK_U32 fbd_offset;
  RK_U32 fbc_hdr_stride;
  RK_U32 ver_virstride;
  MppFrame mframe;
  void *pvStack_90;
  RK_U32 stream_buf_size;
  void *rps_ptr;
  HalH265dCtx *reg_ctx;
  h265d_dxva2_picture_context_t *dxva_cxt;
  RK_S32 distance;
  RK_S32 fd;
  HalBuf *mv_buf;
  MppBuffer framebuf;
  RK_S32 valid_ref;
  RK_S32 aglin_offset;
  MppBuffer streambuf;
  Vdpu382H265dRegSet *pVStack_48;
  RK_S32 ret;
  Vdpu382H265dRegSet *hw_regs;
  int local_38;
  RK_S32 virstrid_y;
  RK_S32 stride_uv;
  RK_S32 stride_y;
  RK_S32 height;
  RK_S32 width;
  RK_S32 log2_min_cb_size;
  RK_S32 i;
  HalTaskInfo *syn_local;
  void *hal_local;
  
  width = 0;
  streambuf._4_4_ = 0;
  _valid_ref = (MppBuffer)0x0;
  framebuf._4_4_ = 0;
  framebuf._0_4_ = 0xffffffff;
  mv_buf = (HalBuf *)0x0;
  _distance = (HalBuf *)0x0;
  dxva_cxt._4_4_ = 0xffffffff;
  dxva_cxt._0_4_ = 0x7fffffff;
  reg_ctx = (HalH265dCtx *)(syn->dec).syntax.data;
  pvStack_90 = (void *)0x0;
  mframe._4_4_ = 0;
  rps_ptr = hal;
  _log2_min_cb_size = syn;
  syn_local = (HalTaskInfo *)hal;
  if ((((syn->dec).flags.val >> 2 & 1) == 0) &&
     ((((syn->dec).flags.val >> 3 & 1) == 0 || (*(int *)(*(long *)((long)hal + 0x18) + 0x30) != 0)))
     ) {
    if (*(int *)((long)hal + 0x180) == 0) {
      (syn->dec).reg_index = 0;
    }
    else {
      for (width = 0; width < 3; width = width + 1) {
        if (*(int *)((long)hal + (long)width * 0x28 + 0x108) == 0) {
          (syn->dec).reg_index = width;
          *(undefined4 *)((long)hal + 0x1fc) = *(undefined4 *)((long)hal + (long)width * 4 + 0x1d8);
          *(undefined4 *)((long)hal + 0x200) = *(undefined4 *)((long)hal + (long)width * 4 + 0x1e4);
          *(undefined4 *)((long)hal + 0x204) = *(undefined4 *)((long)hal + (long)width * 4 + 0x1f0);
          *(undefined8 *)((long)hal + 0x100) =
               *(undefined8 *)((long)hal + (long)width * 0x28 + 0x128);
          *(undefined4 *)((long)hal + (long)width * 0x28 + 0x108) = 1;
          break;
        }
      }
      if (width == 3) {
        _mpp_log_l(2,"hal_h265d_vdpu382","hevc rps buf all used",(char *)0x0);
        return MPP_ERR_NOMEM;
      }
    }
    pvStack_90 = mpp_buffer_get_ptr_with_caller
                           (*(MppBuffer *)((long)hal + 0x1c8),"hal_h265d_vdpu382_gen_regs");
    pvStack_90 = (void *)((long)pvStack_90 + (ulong)*(uint *)((long)rps_ptr + 0x200));
    if (pvStack_90 == (void *)0x0) {
      _mpp_log_l(2,"hal_h265d_vdpu382","rps_data get ptr error",(char *)0x0);
      hal_local._4_4_ = MPP_ERR_NOMEM;
    }
    else if ((_log2_min_cb_size->dec).syntax.data == (void *)0x0) {
      _mpp_log_l(2,"hal_h265d_vdpu382","%s:%s:%d dxva is NULL",(char *)0x0,
                 "/workspace/llm4binary/github/license_c_cmakelists/HermanChen[P]mpp/mpp/hal/rkdec/h265d/hal_h265d_vdpu382.c"
                 ,"hal_h265d_vdpu382_gen_regs",0x2c1);
      hal_local._4_4_ = MPP_ERR_NULL_PTR;
    }
    else {
      pVStack_48 = *(Vdpu382H265dRegSet **)((long)rps_ptr + 0x100);
      memset(pVStack_48,0,700);
      if (*(long *)((long)rps_ptr + 0x100) == 0) {
        hal_local._4_4_ = MPP_ERR_NULL_PTR;
      }
      else {
        height = (byte)(char)reg_ctx->client_type + 3;
        stride_y = (uint)*(ushort *)&reg_ctx->api << ((byte)height & 0x1f);
        stride_uv = (uint)*(ushort *)((long)&reg_ctx->api + 2) << ((byte)height & 0x1f);
        streambuf._4_4_ = hal_h265d_vdpu382_setup_colmv_buf(syn_local,_log2_min_cb_size);
        if (streambuf._4_4_ == MPP_OK) {
          _fbc_hdr_stride = (MppFrame)0x0;
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)((long)rps_ptr + 0x20),
                     (uint)(*(byte *)((long)&reg_ctx->api + 6) & 0x7f),SLOT_FRAME_PTR,
                     &fbc_hdr_stride);
          virstrid_y = mpp_frame_get_hor_stride(_fbc_hdr_stride);
          fbd_offset = mpp_frame_get_ver_stride(_fbc_hdr_stride);
          local_38 = virstrid_y;
          hw_regs._4_4_ = fbd_offset * virstrid_y;
          (pVStack_48->common).reg013 =
               (SWREG13_EN_MODE_SET_conflict)
               ((uint)(pVStack_48->common).reg013 & 0xfffbffff | 0x40000);
          (pVStack_48->common).reg021 =
               (SWREG21_ERROR_CTRL_SET)((uint)(pVStack_48->common).reg021 & 0xfffffffb | 4);
          (pVStack_48->common).reg021 =
               (SWREG21_ERROR_CTRL_SET)((uint)(pVStack_48->common).reg021 & 0xfffffffe);
          (pVStack_48->common).reg021 =
               (SWREG21_ERROR_CTRL_SET)((uint)(pVStack_48->common).reg021 & 0xfffffffd | 2);
          (pVStack_48->common).reg017 =
               (SWREG17_SLICE_NUMBER)
               ((uint)(pVStack_48->common).reg017 & 0xfe000000 |
               *(uint *)((long)&reg_ctx[0xd].g_buf[2].hw_regs + 4) & 0x1ffffff);
          (pVStack_48->h265d_param).reg64 =
               (SWREG64_H26X_SET)((uint)(pVStack_48->h265d_param).reg64 & 0xfffffffd);
          (pVStack_48->h265d_param).reg64 =
               (SWREG64_H26X_SET)((uint)(pVStack_48->h265d_param).reg64 & 0xfffffffe);
          (pVStack_48->h265d_param).reg64 =
               (SWREG64_H26X_SET)((uint)(pVStack_48->h265d_param).reg64 & 0xfffffffb);
          MVar1 = mpp_frame_get_fmt(_fbc_hdr_stride);
          if ((MVar1 & 0xf00000) == MPP_FMT_YUV420SP) {
            (pVStack_48->common).reg012 =
                 (SWREG12_SENCODARY_EN_conflict)((uint)(pVStack_48->common).reg012 & 0xfffffffb);
            (pVStack_48->common).reg018 =
                 (SWREG18_Y_HOR_STRIDE)
                 ((uint)(pVStack_48->common).reg018 & 0xffff0000 | virstrid_y >> 4 & 0xffffU);
            (pVStack_48->common).reg019 =
                 (SWREG19_UV_HOR_STRIDE)
                 ((uint)(pVStack_48->common).reg019 & 0xffff0000 | local_38 >> 4 & 0xffffU);
            (pVStack_48->common).field_12 =
                 (anon_union_4_2_0d70da0d_for_Vdpu382RegCommon_t_12)
                 ((uint)(pVStack_48->common).field_12 & 0xf0000000 | hw_regs._4_4_ >> 4 & 0xfffffffU
                 );
          }
          else {
            local_a8 = mpp_frame_get_fbc_hdr_stride(_fbc_hdr_stride);
            mframe_1._4_4_ = (local_a8 * (fbd_offset + 0x40) >> 4) + 0xfff & 0xfffff000;
            (pVStack_48->common).reg012 =
                 (SWREG12_SENCODARY_EN_conflict)((uint)(pVStack_48->common).reg012 & 0xfffffffb | 4)
            ;
            (pVStack_48->common).reg018 =
                 (SWREG18_Y_HOR_STRIDE)
                 ((uint)(pVStack_48->common).reg018 & 0xffff0000 | local_a8 >> 4 & 0xffff);
            (pVStack_48->common).reg019 =
                 (SWREG19_UV_HOR_STRIDE)
                 ((uint)(pVStack_48->common).reg019 & 0xffff0000 | local_a8 >> 4 & 0xffff);
            (pVStack_48->common).field_12 =
                 (anon_union_4_2_0d70da0d_for_Vdpu382RegCommon_t_12)
                 ((uint)(pVStack_48->common).field_12 & 0xf | mframe_1._4_4_);
          }
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)((long)rps_ptr + 0x20),
                     (uint)(*(byte *)((long)&reg_ctx->api + 6) & 0x7f),SLOT_BUFFER,&mv_buf);
          RVar2 = mpp_buffer_get_fd_with_caller(mv_buf,"hal_h265d_vdpu382_gen_regs");
          (pVStack_48->common_addr).reg130_decout_base = RVar2;
          if ((pVStack_48->common_addr).reg130_decout_base == 0) {
            hal_local._4_4_ = MPP_OK;
          }
          else {
            dxva_cxt._4_4_ = mpp_buffer_get_fd_with_caller(mv_buf,"hal_h265d_vdpu382_gen_regs");
            (pVStack_48->common_addr).reg130_decout_base = dxva_cxt._4_4_;
            _distance = hal_bufs_get_buf(*(HalBufs *)((long)rps_ptr + 0x1a8),
                                         (uint)(*(byte *)((long)&reg_ctx->api + 6) & 0x7f));
            RVar2 = mpp_buffer_get_fd_with_caller(*_distance->buf,"hal_h265d_vdpu382_gen_regs");
            (pVStack_48->common_addr).reg131_colmv_cur_base = RVar2;
            (pVStack_48->h265d_param).reg65 = (SWREG65_CUR_POC)reg_ctx->rcb_info[1].offset;
            mpp_buf_slot_get_prop
                      (*(MppBufSlots *)((long)rps_ptr + 0x28),(_log2_min_cb_size->dec).input,
                       SLOT_BUFFER,&valid_ref);
            if (reg_ctx[0xd].dec_cb == (MppCbCtx *)0x0) {
              pMVar3 = (MppCbCtx *)
                       mpp_buffer_get_ptr_with_caller(_valid_ref,"hal_h265d_vdpu382_gen_regs");
              reg_ctx[0xd].dec_cb = pMVar3;
            }
            (pVStack_48->h265d_param).reg103 =
                 (SWREG103_HEVC_MVC0)((uint)(pVStack_48->h265d_param).reg103 & 0xffff0000 | 0xffff);
            hal_h265d_slice_hw_rps
                      ((_log2_min_cb_size->dec).syntax.data,pvStack_90,
                       *(void **)((long)rps_ptr + 0x210),*(RK_U32 *)((long)rps_ptr + 0x180));
            (pVStack_48->h265d_addr).reg197_cabactbl_base = *(RK_U32 *)((long)rps_ptr + 0x1d0);
            (pVStack_48->h265d_addr).reg161_pps_base = *(RK_U32 *)((long)rps_ptr + 0x1d0);
            (pVStack_48->h265d_addr).reg163_rps_base = *(RK_U32 *)((long)rps_ptr + 0x1d0);
            RVar2 = mpp_buffer_get_fd_with_caller(_valid_ref,"hal_h265d_vdpu382_gen_regs");
            (pVStack_48->common_addr).reg128_rlc_base = RVar2;
            RVar2 = mpp_buffer_get_fd_with_caller(_valid_ref,"hal_h265d_vdpu382_gen_regs");
            (pVStack_48->common_addr).reg129_rlcwrite_base = RVar2;
            sVar4 = mpp_buffer_get_size_with_caller(_valid_ref,"hal_h265d_vdpu382_gen_regs");
            mframe._4_4_ = (uint)sVar4;
            (pVStack_48->common).reg016_str_len =
                 (reg_ctx[0xd].fast_mode_err_found + 0xf & 0xfffffff0) + 0x40;
            local_cc = mframe._4_4_;
            if ((pVStack_48->common).reg016_str_len < mframe._4_4_) {
              local_cc = (pVStack_48->common).reg016_str_len;
            }
            (pVStack_48->common).reg016_str_len = local_cc;
            framebuf._4_4_ = (pVStack_48->common).reg016_str_len - reg_ctx[0xd].fast_mode_err_found;
            if (0 < framebuf._4_4_) {
              memset((void *)((long)&(reg_ctx[0xd].dec_cb)->callBack +
                             (ulong)reg_ctx[0xd].fast_mode_err_found),0,(long)framebuf._4_4_);
            }
            (pVStack_48->common).reg010 =
                 (SWREG10_DEC_E)((uint)(pVStack_48->common).reg010 & 0xfffffffe | 1);
            if (*(long *)((long)rps_ptr + 0x230) == 0) {
              local_d0 = 0;
            }
            else {
              local_d0 = (uint)(*(ulong *)(*(long *)((long)rps_ptr + 0x230) + 4) >> 0xe) & 1;
            }
            (pVStack_48->common).reg012 =
                 (SWREG12_SENCODARY_EN_conflict)
                 ((uint)(pVStack_48->common).reg012 & 0xfffffffd | local_d0 << 1);
            (pVStack_48->common).reg024 = (SWREG24_CABAC_ERROR_EN_LOWBITS)0xffffdfff;
            (pVStack_48->common).reg025 =
                 (SWREG25_CABAC_ERROR_EN_HIGHBITS)
                 ((uint)(pVStack_48->common).reg025 & 0xc0000000 | 0x3ffbf9ff);
            (pVStack_48->common).reg011 =
                 (SWREG11_IMPORTANT_EN_conflict)((uint)(pVStack_48->common).reg011 & 0xfffffffd | 2)
            ;
            (pVStack_48->common).reg011 =
                 (SWREG11_IMPORTANT_EN_conflict)
                 ((uint)(pVStack_48->common).reg011 & 0xffbfffff | 0x400000);
            (pVStack_48->common).reg011 =
                 (SWREG11_IMPORTANT_EN_conflict)
                 ((uint)(pVStack_48->common).reg011 & 0xff7fffff | 0x800000);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffffffe | 1);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffffffd | 2);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffffffb | 4);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffffff7 | 8);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xffffffef | 0x10);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffffeff | 0x100);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffffdff | 0x200);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffffbff | 0x400);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffff7ff | 0x800);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffeffff | 0x10000);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0xfffdffff | 0x20000);
            (pVStack_48->common).reg026 =
                 (SWREG26_BLOCK_GATING_EN_conflict)
                 ((uint)(pVStack_48->common).reg026 & 0x7fffffff | 0x80000000);
            (pVStack_48->common).reg032_timeout_threshold = 0x3ffff;
            framebuf._0_4_ = (pVStack_48->common_addr).reg130_decout_base;
            *(byte *)((long)rps_ptr + (long)(_log2_min_cb_size->dec).reg_index + 0x1c3) =
                 *(byte *)((long)&reg_ctx->api + 6) & 0x7f;
            (pVStack_48->common_addr).reg132_error_ref_base = (RK_U32)framebuf;
            memset(&(pVStack_48->highpoc).reg205,0,4);
            for (width = 0; width < 0xf; width = width + 1) {
              if ((*(char *)((long)&reg_ctx->rcb_info[2].reg + (long)width) != -1) &&
                 (*(char *)((long)&reg_ctx->rcb_info[2].reg + (long)width) != '\x7f')) {
                mframe_2 = (MppFrame)0x0;
                (pVStack_48->h265d_param).reg67_82_ref_poc[width] =
                     (&reg_ctx->rcb_info[3].size)[width];
                mpp_buf_slot_get_prop
                          (*(MppBufSlots *)((long)rps_ptr + 0x20),
                           (uint)(*(byte *)((long)&reg_ctx->rcb_info[2].reg + (long)width) & 0x7f),
                           SLOT_BUFFER,&mv_buf);
                mpp_buf_slot_get_prop
                          (*(MppBufSlots *)((long)rps_ptr + 0x20),
                           (uint)(*(byte *)((long)&reg_ctx->rcb_info[2].reg + (long)width) & 0x7f),
                           SLOT_FRAME_PTR,&mframe_2);
                if (mv_buf == (HalBuf *)0x0) {
                  (pVStack_48->h265d_addr).reg164_179_ref_base[width] = (RK_U32)framebuf;
                }
                else {
                  RVar2 = mpp_buffer_get_fd_with_caller(mv_buf,"hal_h265d_vdpu382_gen_regs");
                  (pVStack_48->h265d_addr).reg164_179_ref_base[width] = RVar2;
                  framebuf._0_4_ = (pVStack_48->h265d_addr).reg164_179_ref_base[width];
                  if (*(int *)((long)reg_ctx->rcb_buf + 0xc) < (&reg_ctx->rcb_info[3].size)[width])
                  {
                    local_d4 = (&reg_ctx->rcb_info[3].size)[width] -
                               *(int *)((long)reg_ctx->rcb_buf + 0xc);
                  }
                  else {
                    local_d4 = *(int *)((long)reg_ctx->rcb_buf + 0xc) -
                               (&reg_ctx->rcb_info[3].size)[width];
                  }
                  if ((local_d4 < (int)dxva_cxt) &&
                     (RVar2 = mpp_frame_get_errinfo(mframe_2), RVar2 == 0)) {
                    if (*(int *)((long)reg_ctx->rcb_buf + 0xc) < (&reg_ctx->rcb_info[3].size)[width]
                       ) {
                      local_d8 = (&reg_ctx->rcb_info[3].size)[width] -
                                 *(int *)((long)reg_ctx->rcb_buf + 0xc);
                    }
                    else {
                      local_d8 = *(int *)((long)reg_ctx->rcb_buf + 0xc) -
                                 (&reg_ctx->rcb_info[3].size)[width];
                    }
                    dxva_cxt._0_4_ = local_d8;
                    (pVStack_48->common_addr).reg132_error_ref_base =
                         (pVStack_48->h265d_addr).reg164_179_ref_base[width];
                    *(byte *)((long)rps_ptr + (long)(_log2_min_cb_size->dec).reg_index + 0x1c3) =
                         *(byte *)((long)&reg_ctx->rcb_info[2].reg + (long)width) & 0x7f;
                    (pVStack_48->common).reg021 =
                         (SWREG21_ERROR_CTRL_SET)((uint)(pVStack_48->common).reg021 & 0xfffffffd);
                  }
                }
                _distance = hal_bufs_get_buf(*(HalBufs *)((long)rps_ptr + 0x1a8),
                                             (uint)(*(byte *)((long)&reg_ctx->rcb_info[2].reg +
                                                             (long)width) & 0x7f));
                RVar2 = mpp_buffer_get_fd_with_caller(*_distance->buf,"hal_h265d_vdpu382_gen_regs");
                (pVStack_48->h265d_addr).reg181_196_colmv_base[width] = RVar2;
                switch(width) {
                case 0:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffffffe | 1);
                  break;
                case 1:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffffffd | 2);
                  break;
                case 2:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffffffb | 4);
                  break;
                case 3:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffffff7 | 8);
                  break;
                case 4:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffffeff | 0x100);
                  break;
                case 5:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffffdff | 0x200);
                  break;
                case 6:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffffbff | 0x400);
                  break;
                case 7:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffff7ff | 0x800);
                  break;
                case 8:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffeffff | 0x10000);
                  break;
                case 9:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffdffff | 0x20000);
                  break;
                case 10:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfffbffff | 0x40000);
                  break;
                case 0xb:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfff7ffff | 0x80000);
                  break;
                case 0xc:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfeffffff | 0x1000000);
                  break;
                case 0xd:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfdffffff | 0x2000000);
                  break;
                case 0xe:
                  (pVStack_48->h265d_param).reg99 =
                       (SWREG99_HEVC_REF_VALID)
                       ((uint)(pVStack_48->h265d_param).reg99 & 0xfbffffff | 0x4000000);
                }
              }
            }
            if ((*(byte *)((long)rps_ptr + (long)(_log2_min_cb_size->dec).reg_index + 0x1c3) ==
                 (*(byte *)((long)&reg_ctx->api + 6) & 0x7f)) &&
               ((*(uint *)((long)&reg_ctx->cfg + 4) >> 0x12 & 1) == 0)) {
              if ((hal_h265d_debug & 0x20) != 0) {
                _mpp_log_l(4,"hal_h265d_vdpu382","current frm may be err, should skip process",
                           (char *)0x0);
              }
              (_log2_min_cb_size->dec).flags.val =
                   (_log2_min_cb_size->dec).flags.val & 0xfffffffffffffff7 | 8;
              hal_local._4_4_ = MPP_OK;
            }
            else {
              for (width = 0; width < 0xf; width = width + 1) {
                if ((*(char *)((long)&reg_ctx->rcb_info[2].reg + (long)width) == -1) ||
                   (*(char *)((long)&reg_ctx->rcb_info[2].reg + (long)width) == '\x7f')) {
                  _distance = hal_bufs_get_buf(*(HalBufs *)((long)rps_ptr + 0x1a8),
                                               (uint)*(byte *)((long)rps_ptr +
                                                              (long)(_log2_min_cb_size->dec).
                                                                    reg_index + 0x1c3));
                  (pVStack_48->h265d_addr).reg164_179_ref_base[width] =
                       (pVStack_48->common_addr).reg132_error_ref_base;
                  RVar2 = mpp_buffer_get_fd_with_caller
                                    (*_distance->buf,"hal_h265d_vdpu382_gen_regs");
                  (pVStack_48->h265d_addr).reg181_196_colmv_base[width] = RVar2;
                  if (*(byte *)((long)rps_ptr + (long)(_log2_min_cb_size->dec).reg_index + 0x1c3) ==
                      (*(byte *)((long)&reg_ctx->api + 6) & 0x7f)) {
                    switch(width) {
                    case 0:
                      (pVStack_48->highpoc).reg200 =
                           (SWREG200_REF0_7_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg200 & 0xfffffff0 | 3);
                      break;
                    case 1:
                      (pVStack_48->highpoc).reg200 =
                           (SWREG200_REF0_7_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg200 & 0xffffff0f | 0x30);
                      break;
                    case 2:
                      (pVStack_48->highpoc).reg200 =
                           (SWREG200_REF0_7_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg200 & 0xfffff0ff | 0x300);
                      break;
                    case 3:
                      (pVStack_48->highpoc).reg200 =
                           (SWREG200_REF0_7_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg200 & 0xffff0fff | 0x3000);
                      break;
                    case 4:
                      (pVStack_48->highpoc).reg200 =
                           (SWREG200_REF0_7_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg200 & 0xfff0ffff | 0x30000);
                      break;
                    case 5:
                      (pVStack_48->highpoc).reg200 =
                           (SWREG200_REF0_7_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg200 & 0xff0fffff | 0x300000);
                      break;
                    case 6:
                      (pVStack_48->highpoc).reg200 =
                           (SWREG200_REF0_7_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg200 & 0xf0ffffff | 0x3000000);
                      break;
                    case 7:
                      (pVStack_48->highpoc).reg200 =
                           (SWREG200_REF0_7_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg200 & 0xfffffff | 0x30000000);
                      break;
                    case 8:
                      (pVStack_48->highpoc).reg201 =
                           (SWREG201_REF8_15_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg201 & 0xfffffff0 | 3);
                      break;
                    case 9:
                      (pVStack_48->highpoc).reg201 =
                           (SWREG201_REF8_15_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg201 & 0xffffff0f | 0x30);
                      break;
                    case 10:
                      (pVStack_48->highpoc).reg201 =
                           (SWREG201_REF8_15_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg201 & 0xfffff0ff | 0x300);
                      break;
                    case 0xb:
                      (pVStack_48->highpoc).reg201 =
                           (SWREG201_REF8_15_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg201 & 0xffff0fff | 0x3000);
                      break;
                    case 0xc:
                      (pVStack_48->highpoc).reg201 =
                           (SWREG201_REF8_15_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg201 & 0xfff0ffff | 0x30000);
                      break;
                    case 0xd:
                      (pVStack_48->highpoc).reg201 =
                           (SWREG201_REF8_15_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg201 & 0xff0fffff | 0x300000);
                      break;
                    case 0xe:
                      (pVStack_48->highpoc).reg201 =
                           (SWREG201_REF8_15_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg201 & 0xf0ffffff | 0x3000000);
                      break;
                    case 0xf:
                      (pVStack_48->highpoc).reg201 =
                           (SWREG201_REF8_15_POC_HIGHBIT)
                           ((uint)(pVStack_48->highpoc).reg201 & 0xfffffff | 0x30000000);
                    }
                  }
                }
                else {
                  mframe_3 = (MppFrame)0x0;
                  mpp_buf_slot_get_prop
                            (*(MppBufSlots *)((long)rps_ptr + 0x20),
                             (uint)(*(byte *)((long)&reg_ctx->rcb_info[2].reg + (long)width) & 0x7f)
                             ,SLOT_BUFFER,&mv_buf);
                  mpp_buf_slot_get_prop
                            (*(MppBufSlots *)((long)rps_ptr + 0x20),
                             (uint)(*(byte *)((long)&reg_ctx->rcb_info[2].reg + (long)width) & 0x7f)
                             ,SLOT_FRAME_PTR,&mframe_3);
                  if ((mv_buf == (HalBuf *)0x0) ||
                     (RVar2 = mpp_frame_get_errinfo(mframe_3), RVar2 != 0)) {
                    _distance = hal_bufs_get_buf(*(HalBufs *)((long)rps_ptr + 0x1a8),
                                                 (uint)*(byte *)((long)rps_ptr +
                                                                (long)(_log2_min_cb_size->dec).
                                                                      reg_index + 0x1c3));
                    (pVStack_48->h265d_addr).reg164_179_ref_base[width] =
                         (pVStack_48->common_addr).reg132_error_ref_base;
                    RVar2 = mpp_buffer_get_fd_with_caller
                                      (*_distance->buf,"hal_h265d_vdpu382_gen_regs");
                    (pVStack_48->h265d_addr).reg181_196_colmv_base[width] = RVar2;
                  }
                }
              }
              hal_h265d_v382_output_pps_packet(syn_local,(_log2_min_cb_size->dec).syntax.data);
              mpp_dev_set_reg_offset
                        (*(MppDev *)((long)rps_ptr + 0x10),0xa1,*(RK_U32 *)((long)rps_ptr + 0x1fc));
              mpp_dev_set_reg_offset
                        (*(MppDev *)((long)rps_ptr + 0x10),0xa3,*(RK_U32 *)((long)rps_ptr + 0x200));
              (pVStack_48->common).reg013 =
                   (SWREG13_EN_MODE_SET_conflict)
                   ((uint)(pVStack_48->common).reg013 & 0xfeffffff |
                   (*(uint *)((long)&reg_ctx->cfg + 4) >> 0x11 & 1) << 0x18);
              (pVStack_48->common).reg011 =
                   (SWREG11_IMPORTANT_EN_conflict)
                   ((uint)(pVStack_48->common).reg011 & 0xffffffbf | 0x40);
              hal_h265d_rcb_info_update(syn_local,reg_ctx,pVStack_48,stride_y,stride_uv);
              if (*(int *)((long)rps_ptr + 0x180) == 0) {
                local_100 = *(MppBuffer *)((long)rps_ptr + 0xe8);
              }
              else {
                local_100 = *(MppBuffer *)
                             ((long)rps_ptr + (long)(_log2_min_cb_size->dec).reg_index * 8 + 0xe8);
              }
              vdpu382_setup_rcb(&pVStack_48->common_addr,*(MppDev *)((long)rps_ptr + 0x10),local_100
                                ,(Vdpu382RcbInfo *)((long)rps_ptr + 100));
              local_c8 = (MppFrame)0x0;
              mpp_buf_slot_get_prop
                        (*(MppBufSlots *)((long)rps_ptr + 0x20),
                         (uint)(*(byte *)((long)&reg_ctx->api + 6) & 0x7f),SLOT_FRAME_PTR,&local_c8)
              ;
              RVar2 = mpp_frame_get_thumbnail_en(local_c8);
              if (RVar2 == 0) {
                (pVStack_48->h265d_addr).reg198_scale_down_luma_base = 0;
                (pVStack_48->h265d_addr).reg199_scale_down_chorme_base = 0;
                (pVStack_48->common).reg012 =
                     (SWREG12_SENCODARY_EN_conflict)((uint)(pVStack_48->common).reg012 & 0xfffffdff)
                ;
              }
              else {
                (pVStack_48->h265d_addr).reg198_scale_down_luma_base =
                     (pVStack_48->common_addr).reg130_decout_base;
                (pVStack_48->h265d_addr).reg199_scale_down_chorme_base =
                     (pVStack_48->common_addr).reg130_decout_base;
                vdpu382_setup_down_scale
                          (local_c8,*(MppDev *)((long)rps_ptr + 0x10),&pVStack_48->common);
              }
              vdpu382_setup_statistic(&pVStack_48->common,&pVStack_48->statistic);
              mpp_buffer_sync_end_f
                        (*(MppBuffer *)((long)rps_ptr + 0x1c8),0,"hal_h265d_vdpu382_gen_regs");
              hal_local._4_4_ = streambuf._4_4_;
            }
          }
        }
        else {
          hal_local._4_4_ = MPP_ERR_NOMEM;
        }
      }
    }
  }
  else {
    if ((hal_h265d_debug & 0x20) != 0) {
      _mpp_log_l(4,"hal_h265d_vdpu382","%s found task error\n",(char *)0x0,
                 "hal_h265d_vdpu382_gen_regs");
    }
    hal_local._4_4_ = MPP_OK;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_h265d_vdpu382_gen_regs(void *hal,  HalTaskInfo *syn)
{
    RK_S32 i = 0;
    RK_S32 log2_min_cb_size;
    RK_S32 width, height;
    RK_S32 stride_y, stride_uv, virstrid_y;
    Vdpu382H265dRegSet *hw_regs;
    RK_S32 ret = MPP_SUCCESS;
    MppBuffer streambuf = NULL;
    RK_S32 aglin_offset = 0;
    RK_S32 valid_ref = -1;
    MppBuffer framebuf = NULL;
    HalBuf *mv_buf = NULL;
    RK_S32 fd = -1;
    RK_S32 distance = INT_MAX;
    h265d_dxva2_picture_context_t *dxva_cxt =
        (h265d_dxva2_picture_context_t *)syn->dec.syntax.data;
    HalH265dCtx *reg_ctx = ( HalH265dCtx *)hal;
    void *rps_ptr = NULL;
    RK_U32 stream_buf_size = 0;

    if (syn->dec.flags.parse_err ||
        (syn->dec.flags.ref_err && !reg_ctx->cfg->base.disable_error)) {
        h265h_dbg(H265H_DBG_TASK_ERR, "%s found task error\n", __FUNCTION__);
        return MPP_OK;
    }

    if (reg_ctx ->fast_mode) {
        for (i = 0; i < MAX_GEN_REG; i++) {
            if (!reg_ctx->g_buf[i].use_flag) {
                syn->dec.reg_index = i;

                reg_ctx->spspps_offset = reg_ctx->offset_spspps[i];
                reg_ctx->rps_offset = reg_ctx->offset_rps[i];
                reg_ctx->sclst_offset = reg_ctx->offset_sclst[i];

                reg_ctx->hw_regs = reg_ctx->g_buf[i].hw_regs;
                reg_ctx->g_buf[i].use_flag = 1;
                break;
            }
        }
        if (i == MAX_GEN_REG) {
            mpp_err("hevc rps buf all used");
            return MPP_ERR_NOMEM;
        }
    } else {
        syn->dec.reg_index = 0;
    }
    rps_ptr = mpp_buffer_get_ptr(reg_ctx->bufs) + reg_ctx->rps_offset;
    if (NULL == rps_ptr) {

        mpp_err("rps_data get ptr error");
        return MPP_ERR_NOMEM;
    }


    if (syn->dec.syntax.data == NULL) {
        mpp_err("%s:%s:%d dxva is NULL", __FILE__, __FUNCTION__, __LINE__);
        return MPP_ERR_NULL_PTR;
    }

    /* output pps */
    hw_regs = (Vdpu382H265dRegSet*)reg_ctx->hw_regs;
    memset(hw_regs, 0, sizeof(Vdpu382H265dRegSet));

    if (NULL == reg_ctx->hw_regs) {
        return MPP_ERR_NULL_PTR;
    }


    log2_min_cb_size = dxva_cxt->pp.log2_min_luma_coding_block_size_minus3 + 3;

    width = (dxva_cxt->pp.PicWidthInMinCbsY << log2_min_cb_size);
    height = (dxva_cxt->pp.PicHeightInMinCbsY << log2_min_cb_size);
    ret = hal_h265d_vdpu382_setup_colmv_buf(hal, syn);
    if (ret)
        return MPP_ERR_NOMEM;

    {
        MppFrame mframe = NULL;
        RK_U32 ver_virstride;

        mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);
        stride_y = mpp_frame_get_hor_stride(mframe);
        ver_virstride = mpp_frame_get_ver_stride(mframe);
        stride_uv = stride_y;
        virstrid_y = ver_virstride * stride_y;
        hw_regs->common.reg013.h26x_error_mode = 1;
        hw_regs->common.reg021.error_deb_en = 1;
        hw_regs->common.reg021.inter_error_prc_mode = 0;
        hw_regs->common.reg021.error_intra_mode = 1;

        hw_regs->common.reg017.slice_num = dxva_cxt->slice_count;
        hw_regs->h265d_param.reg64.h26x_rps_mode = 0;
        hw_regs->h265d_param.reg64.h26x_frame_orslice = 0;
        hw_regs->h265d_param.reg64.h26x_stream_mode = 0;

        if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
            RK_U32 fbc_hdr_stride = mpp_frame_get_fbc_hdr_stride(mframe);
            RK_U32 fbd_offset = MPP_ALIGN(fbc_hdr_stride * (ver_virstride + 64) / 16, SZ_4K);

            hw_regs->common.reg012.fbc_e = 1;
            hw_regs->common.reg018.y_hor_virstride = fbc_hdr_stride >> 4;
            hw_regs->common.reg019.uv_hor_virstride = fbc_hdr_stride >> 4;
            hw_regs->common.reg020_fbc_payload_off.payload_st_offset = fbd_offset >> 4;
        } else {
            hw_regs->common.reg012.fbc_e = 0;
            hw_regs->common.reg018.y_hor_virstride = stride_y >> 4;
            hw_regs->common.reg019.uv_hor_virstride = stride_uv >> 4;
            hw_regs->common.reg020_y_virstride.y_virstride = virstrid_y >> 4;
        }
    }
    mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.CurrPic.Index7Bits,
                          SLOT_BUFFER, &framebuf);
    hw_regs->common_addr.reg130_decout_base  = mpp_buffer_get_fd(framebuf); //just index need map
    /*if out_base is equal to zero it means this frame may error
    we return directly add by csy*/

    if (hw_regs->common_addr.reg130_decout_base == 0) {
        return 0;
    }
    fd =  mpp_buffer_get_fd(framebuf);
    hw_regs->common_addr.reg130_decout_base = fd;
    mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, dxva_cxt->pp.CurrPic.Index7Bits);
    hw_regs->common_addr.reg131_colmv_cur_base = mpp_buffer_get_fd(mv_buf->buf[0]);

    hw_regs->h265d_param.reg65.cur_top_poc = dxva_cxt->pp.CurrPicOrderCntVal;

    mpp_buf_slot_get_prop(reg_ctx->packet_slots, syn->dec.input, SLOT_BUFFER,
                          &streambuf);
    if ( dxva_cxt->bitstream == NULL) {
        dxva_cxt->bitstream = mpp_buffer_get_ptr(streambuf);
    }
#ifdef HW_RPS
    hw_regs->h265d_param.reg103.ref_pic_layer_same_with_cur = 0xffff;
    hal_h265d_slice_hw_rps(syn->dec.syntax.data, rps_ptr, reg_ctx->sw_rps_buf, reg_ctx->fast_mode);
#else
    hw_regs->sw_sysctrl.sw_h26x_rps_mode = 1;
    hal_h265d_slice_output_rps(syn->dec.syntax.data, rps_ptr);
#endif

    /* cabac table */
    hw_regs->h265d_addr.reg197_cabactbl_base    = reg_ctx->bufs_fd;
    /* pps */
    hw_regs->h265d_addr.reg161_pps_base         = reg_ctx->bufs_fd;
    hw_regs->h265d_addr.reg163_rps_base         = reg_ctx->bufs_fd;

    hw_regs->common_addr.reg128_rlc_base        = mpp_buffer_get_fd(streambuf);
    hw_regs->common_addr.reg129_rlcwrite_base   = mpp_buffer_get_fd(streambuf);
    stream_buf_size                             = mpp_buffer_get_size(streambuf);
    hw_regs->common.reg016_str_len              = ((dxva_cxt->bitstream_size + 15)
                                                   & (~15)) + 64;
    hw_regs->common.reg016_str_len = stream_buf_size > hw_regs->common.reg016_str_len ?
                                     hw_regs->common.reg016_str_len : stream_buf_size;

    aglin_offset =  hw_regs->common.reg016_str_len - dxva_cxt->bitstream_size;
    if (aglin_offset > 0) {
        memset((void *)(dxva_cxt->bitstream + dxva_cxt->bitstream_size), 0,
               aglin_offset);
    }
    hw_regs->common.reg010.dec_e                = 1;
    hw_regs->common.reg012.colmv_compress_en = reg_ctx->hw_info ?
                                               reg_ctx->hw_info->cap_colmv_compress : 0;

    hw_regs->common.reg024.cabac_err_en_lowbits = 0xffffdfff;
    hw_regs->common.reg025.cabac_err_en_highbits = 0x3ffbf9ff;

    hw_regs->common.reg011.dec_clkgate_e    = 1;
    hw_regs->common.reg011.err_head_fill_e  = 1;
    hw_regs->common.reg011.err_colmv_fill_e = 1;

    hw_regs->common.reg026.inter_auto_gating_e = 1;
    hw_regs->common.reg026.filterd_auto_gating_e = 1;
    hw_regs->common.reg026.strmd_auto_gating_e = 1;
    hw_regs->common.reg026.mcp_auto_gating_e = 1;
    hw_regs->common.reg026.busifd_auto_gating_e = 1;
    hw_regs->common.reg026.dec_ctrl_auto_gating_e = 1;
    hw_regs->common.reg026.intra_auto_gating_e = 1;
    hw_regs->common.reg026.mc_auto_gating_e = 1;
    hw_regs->common.reg026.transd_auto_gating_e = 1;
    hw_regs->common.reg026.sram_auto_gating_e = 1;
    hw_regs->common.reg026.cru_auto_gating_e = 1;
    hw_regs->common.reg026.reg_cfg_gating_en = 1;
    hw_regs->common.reg032_timeout_threshold = 0x3ffff;

    valid_ref = hw_regs->common_addr.reg130_decout_base;
    reg_ctx->error_index[syn->dec.reg_index] = dxva_cxt->pp.CurrPic.Index7Bits;
    hw_regs->common_addr.reg132_error_ref_base = valid_ref;

    memset(&hw_regs->highpoc.reg205, 0, sizeof(RK_U32));

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {
        if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff &&
            dxva_cxt->pp.RefPicList[i].bPicEntry != 0x7f) {

            MppFrame mframe = NULL;
            hw_regs->h265d_param.reg67_82_ref_poc[i] = dxva_cxt->pp.PicOrderCntValList[i];
            mpp_buf_slot_get_prop(reg_ctx->slots,
                                  dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_BUFFER, &framebuf);
            mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_FRAME_PTR, &mframe);
            if (framebuf != NULL) {
                hw_regs->h265d_addr.reg164_179_ref_base[i] = mpp_buffer_get_fd(framebuf);
                valid_ref = hw_regs->h265d_addr.reg164_179_ref_base[i];
                // mpp_log("cur poc %d, ref poc %d", dxva_cxt->pp.current_poc, dxva_cxt->pp.PicOrderCntValList[i]);
                if ((pocdistance(dxva_cxt->pp.PicOrderCntValList[i], dxva_cxt->pp.current_poc) < distance)
                    && (!mpp_frame_get_errinfo(mframe))) {
                    distance = pocdistance(dxva_cxt->pp.PicOrderCntValList[i], dxva_cxt->pp.current_poc);
                    hw_regs->common_addr.reg132_error_ref_base = hw_regs->h265d_addr.reg164_179_ref_base[i];
                    reg_ctx->error_index[syn->dec.reg_index] = dxva_cxt->pp.RefPicList[i].Index7Bits;
                    hw_regs->common.reg021.error_intra_mode = 0;

                }
            } else {
                hw_regs->h265d_addr.reg164_179_ref_base[i] = valid_ref;
            }

            mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, dxva_cxt->pp.RefPicList[i].Index7Bits);
            hw_regs->h265d_addr.reg181_196_colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);

            SET_REF_VALID(hw_regs->h265d_param, i, 1);
        }
    }

    if ((reg_ctx->error_index[syn->dec.reg_index] == dxva_cxt->pp.CurrPic.Index7Bits) &&
        !dxva_cxt->pp.IntraPicFlag) {
        h265h_dbg(H265H_DBG_TASK_ERR, "current frm may be err, should skip process");
        syn->dec.flags.ref_err = 1;
        return MPP_OK;
    }

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {

        if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff &&
            dxva_cxt->pp.RefPicList[i].bPicEntry != 0x7f) {
            MppFrame mframe = NULL;

            mpp_buf_slot_get_prop(reg_ctx->slots,
                                  dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_BUFFER, &framebuf);

            mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.RefPicList[i].Index7Bits,
                                  SLOT_FRAME_PTR, &mframe);

            if (framebuf == NULL || mpp_frame_get_errinfo(mframe)) {
                mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, reg_ctx->error_index[syn->dec.reg_index]);
                hw_regs->h265d_addr.reg164_179_ref_base[i] = hw_regs->common_addr.reg132_error_ref_base;
                hw_regs->h265d_addr.reg181_196_colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
            }
        } else {
            mv_buf = hal_bufs_get_buf(reg_ctx->cmv_bufs, reg_ctx->error_index[syn->dec.reg_index]);
            hw_regs->h265d_addr.reg164_179_ref_base[i] = hw_regs->common_addr.reg132_error_ref_base;
            hw_regs->h265d_addr.reg181_196_colmv_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
            /* mark 3 to differ from current frame */
            if (reg_ctx->error_index[syn->dec.reg_index] == dxva_cxt->pp.CurrPic.Index7Bits)
                SET_POC_HIGNBIT_INFO(hw_regs->highpoc, i, poc_highbit, 3);
        }
    }
    hal_h265d_v382_output_pps_packet(hal, syn->dec.syntax.data);

    mpp_dev_set_reg_offset(reg_ctx->dev, 161, reg_ctx->spspps_offset);
    /* rps */
    mpp_dev_set_reg_offset(reg_ctx->dev, 163, reg_ctx->rps_offset);

    hw_regs->common.reg013.cur_pic_is_idr = dxva_cxt->pp.IdrPicFlag;//p_hal->slice_long->idr_flag;

    hw_regs->common.reg011.buf_empty_en = 1;

    hal_h265d_rcb_info_update(hal, dxva_cxt, hw_regs, width, height);
    vdpu382_setup_rcb(&hw_regs->common_addr, reg_ctx->dev, reg_ctx->fast_mode ?
                      reg_ctx->rcb_buf[syn->dec.reg_index] : reg_ctx->rcb_buf[0],
                      (Vdpu382RcbInfo*)reg_ctx->rcb_info);
    {
        MppFrame mframe = NULL;

        mpp_buf_slot_get_prop(reg_ctx->slots, dxva_cxt->pp.CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);

        if (mpp_frame_get_thumbnail_en(mframe)) {
            hw_regs->h265d_addr.reg198_scale_down_luma_base =
                hw_regs->common_addr.reg130_decout_base;
            hw_regs->h265d_addr.reg199_scale_down_chorme_base =
                hw_regs->common_addr.reg130_decout_base;
            vdpu382_setup_down_scale(mframe, reg_ctx->dev, &hw_regs->common);
        } else {
            hw_regs->h265d_addr.reg198_scale_down_luma_base = 0;
            hw_regs->h265d_addr.reg199_scale_down_chorme_base = 0;
            hw_regs->common.reg012.scale_down_en = 0;
        }
    }
    vdpu382_setup_statistic(&hw_regs->common, &hw_regs->statistic);
    mpp_buffer_sync_end(reg_ctx->bufs);

    return ret;
}